

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

bool __thiscall cmCTestBZR::LoadModifications(cmCTestBZR *this)

{
  undefined1 local_190 [8];
  OutputLogger err;
  StatusParser out;
  char *bzr_status [4];
  char *bzr;
  cmCTestBZR *this_local;
  
  out.RegexStatus.searchstring = (char *)std::__cxx11::string::c_str();
  StatusParser::StatusParser((StatusParser *)&err.super_LineParser.Separator,this,"status-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_190,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "status-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&out.RegexStatus.searchstring,
                      (OutputParser *)&err.super_LineParser.Separator,(OutputParser *)local_190,
                      (char *)0x0,Auto);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_190);
  StatusParser::~StatusParser((StatusParser *)&err.super_LineParser.Separator);
  return true;
}

Assistant:

bool cmCTestBZR::LoadModifications()
{
  // Run "bzr status" which reports local modifications.
  const char* bzr = this->CommandLineTool.c_str();
  const char* bzr_status[] = { bzr, "status", "-SV", CM_NULLPTR };
  StatusParser out(this, "status-out> ");
  OutputLogger err(this->Log, "status-err> ");
  this->RunChild(bzr_status, &out, &err);
  return true;
}